

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::GLMRegressor_DoubleArray::GLMRegressor_DoubleArray
          (GLMRegressor_DoubleArray *this,Arena *arena,bool is_message_owned)

{
  bool is_message_owned_local;
  Arena *arena_local;
  GLMRegressor_DoubleArray *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__GLMRegressor_DoubleArray_006fbff0;
  google::protobuf::RepeatedField<double>::RepeatedField(&this->value_,arena);
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  SharedCtor(this);
  if (!is_message_owned) {
    RegisterArenaDtor(this,arena);
  }
  return;
}

Assistant:

GLMRegressor_DoubleArray::GLMRegressor_DoubleArray(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  value_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.GLMRegressor.DoubleArray)
}